

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

bool __thiscall
cs_impl::any::
holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
::compare(holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
          *this,baseHolder *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*obj->_vptr_baseHolder[2])(obj);
  iVar3 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(extraout_var,iVar2),
                     (type_info *)CONCAT44(extraout_var_00,iVar3));
  if (bVar1) {
    bVar1 = phmap::priv::operator==
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                        *)&this->mDat,
                       (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                        *)(obj + 1));
    return bVar1;
  }
  return false;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}